

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool __thiscall Catch::TestSpec::matches(TestSpec *this,TestCaseInfo *testCase)

{
  bool bVar1;
  const_iterator __last;
  const_iterator __pred;
  __normal_iterator<const_Catch::TestSpec::Filter_*,_std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>_>
  in_RSI;
  vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>
  *in_stack_ffffffffffffffc8;
  
  __last = clara::std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::
           begin(in_stack_ffffffffffffffc8);
  __pred = clara::std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::
           end(in_stack_ffffffffffffffc8);
  bVar1 = std::
          any_of<__gnu_cxx::__normal_iterator<Catch::TestSpec::Filter_const*,std::vector<Catch::TestSpec::Filter,std::allocator<Catch::TestSpec::Filter>>>,Catch::TestSpec::matches(Catch::TestCaseInfo_const&)const::__0>
                    (in_RSI,(__normal_iterator<const_Catch::TestSpec::Filter_*,_std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>_>
                             )__last._M_current,
                     (anon_class_8_1_a389c060_for__M_pred)__pred._M_current);
  return bVar1;
}

Assistant:

bool TestSpec::matches( TestCaseInfo const& testCase ) const {
        return std::any_of( m_filters.begin(), m_filters.end(), [&]( Filter const& f ){ return f.matches( testCase ); } );
    }